

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O1

int serial_change_baudrate(int baud)

{
  speed_t __speed;
  int iVar1;
  speed_t baud_00;
  speed_t baud_01;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  char *pcVar5;
  char *format;
  termios newtio;
  char buf [2048];
  termios local_868;
  termios local_828 [34];
  
  local_868.c_iflag = 0;
  local_868.c_oflag = 0;
  local_868.c_line = '\0';
  local_868.c_cc[0] = '\0';
  local_868.c_cc[1] = '\0';
  local_868.c_cc[2] = '\0';
  local_868.c_cc[3] = '\0';
  local_868.c_cc[4] = '\0';
  local_868.c_cc[5] = '\0';
  local_868.c_cc[6] = '\0';
  local_868.c_cc[7] = '\0';
  local_868.c_cc[8] = '\0';
  local_868.c_cc[9] = '\0';
  local_868.c_cc[10] = '\0';
  local_868.c_cc[0xb] = '\0';
  local_868.c_cc[0xc] = '\0';
  local_868.c_cc[0xd] = '\0';
  local_868.c_cc[0xe] = '\0';
  local_868.c_cc[0xf] = '\0';
  local_868.c_cc[0x10] = '\0';
  local_868.c_cc[0x11] = '\0';
  local_868.c_cc[0x12] = '\0';
  local_868.c_cc[0x13] = '\0';
  local_868.c_cc[0x14] = '\0';
  local_868.c_cc[0x15] = '\0';
  local_868.c_cc[0x16] = '\0';
  local_868.c_cc[0x17] = '\0';
  local_868.c_cc[0x18] = '\0';
  local_868.c_cc[0x19] = '\0';
  local_868.c_cc[0x1a] = '\0';
  local_868.c_cc[0x1b] = '\0';
  local_868.c_cc[0x1c] = '\0';
  local_868.c_cc[0x1d] = '\0';
  local_868.c_cc[0x1e] = '\0';
  local_868.c_cc[0x1f] = '\0';
  local_868._49_3_ = 0;
  local_868.c_ispeed = 0;
  local_868.c_ospeed = 0;
  local_868.c_cflag = 0x800008b0;
  local_868.c_lflag = 0;
  puVar4 = (uint *)__errno_location();
  *puVar4 = 0;
  __speed = i2baud(baud);
  iVar1 = cfsetispeed(&local_868,__speed);
  if (iVar1 < 0) {
    uVar2 = *puVar4;
    yprintf(OUTPUT_LV_ERROR,"Error: Failed to set input baud rate to %d\n",baud);
    pcVar5 = strerror(uVar2);
    format = "Error: cfsetispeed: %s(%d)\n";
  }
  else {
    *puVar4 = 0;
    iVar1 = cfsetospeed(&local_868,__speed);
    if (iVar1 < 0) {
      uVar2 = *puVar4;
      yprintf(OUTPUT_LV_ERROR,"Error: Failed to set output baud rate to %d\n",baud);
      pcVar5 = strerror(uVar2);
      format = "Error: cfsetospeed: %s(%d)\n";
    }
    else {
      SER_BAUDRATE = (double)baud;
      local_868.c_iflag = 4;
      local_868.c_oflag = 0;
      local_868.c_cc._5_2_ = 0x100;
      iVar1 = tcsetattr(g_device_port,2,&local_868);
      if (iVar1 == 0) {
        *puVar4 = 0;
        iVar1 = tcgetattr(g_device_port,local_828);
        if (iVar1 < 0) {
          uVar2 = *puVar4;
          yprintf(OUTPUT_LV_ERROR,"Error: Failed to get  attribute of serial port\n");
          pcVar5 = strerror(uVar2);
          yprintf(OUTPUT_LV_DEBUG,"Error: tcgetattr: %s(%d)\n",pcVar5,(ulong)uVar2);
        }
        else {
          baud_00 = cfgetispeed(local_828);
          baud_01 = cfgetospeed(local_828);
          uVar2 = baud2i(baud_00);
          if ((uVar2 == baud) && (iVar1 = baud2i(baud_01), iVar1 == baud)) {
            iVar1 = option(OPTION_DO_NOT_USE_YP);
            if (iVar1 != 0) {
              return 1;
            }
            write(g_device_port,"\n\nVV\n\n",6);
            yp_usleep(10000);
            serial_recieve(recieve_throw,local_828);
            return 1;
          }
          uVar3 = baud2i(baud_01);
          yprintf(OUTPUT_LV_ERROR,
                  "Error: Requested baudrate is %d/%d, \n   but sellected baudrate is %d/%d.\n",baud
                  ,baud,(ulong)uVar2,(ulong)uVar3);
        }
        return 0;
      }
      uVar2 = *puVar4;
      yprintf(OUTPUT_LV_ERROR,"Error: Failed to set attribute of serial port\n");
      pcVar5 = strerror(uVar2);
      format = "Error: tcsetattr: %s(%d)\n";
    }
  }
  yprintf(OUTPUT_LV_DEBUG,format,pcVar5,(ulong)uVar2);
  return 0;
}

Assistant:

int serial_change_baudrate(int baud)
{
#if !defined(__MINGW32__)
  struct termios newtio;
  int ret, errnum;
  char buf[2048];

  memset(&newtio, 0, sizeof(newtio));  // 新しいポートの設定の構造体をクリアする

  // シリアルのボーレートを設定
  // 8bit 通信
  // スタートビット1
  // エンドビット１
  // パリティー無し
  // 合計 10bit

  newtio.c_cflag = CS8 | CLOCAL | CREAD | CRTSCTS;
  errno = 0;
  ret = cfsetispeed(&newtio, i2baud(baud));
  if (ret < 0)
  {
    errnum = errno;
    yprintf(OUTPUT_LV_ERROR, "Error: Failed to set input baud rate to %d\n", baud);
    yprintf(OUTPUT_LV_DEBUG, "Error: cfsetispeed: %s(%d)\n", strerror(errnum), errnum);
    return 0;
  }
  errno = 0;
  ret = cfsetospeed(&newtio, i2baud(baud));
  if (ret < 0)
  {
    errnum = errno;
    yprintf(OUTPUT_LV_ERROR, "Error: Failed to set output baud rate to %d\n", baud);
    yprintf(OUTPUT_LV_DEBUG, "Error: cfsetospeed: %s(%d)\n", strerror(errnum), errnum);
    return 0;
  }
  SER_BAUDRATE = (double)baud;
  newtio.c_iflag = IGNPAR;  // パリティエラーのデータは無視する
  newtio.c_oflag = 0;       // Disable implementation dependent processing

  newtio.c_cc[VTIME] = 0; /* キャラクタ間タイマを使わない */
  newtio.c_cc[VMIN] = 1;  /* 1文字来るまで，読み込みをブロックする */

  if (tcsetattr(g_device_port, TCSAFLUSH, &newtio))
  {
    errnum = errno;
    yprintf(OUTPUT_LV_ERROR, "Error: Failed to set attribute of serial port\n");
    yprintf(OUTPUT_LV_DEBUG, "Error: tcsetattr: %s(%d)\n", strerror(errnum), errnum);
    return 0;
  }

  {  // ---> check bit rate
    struct termios term;
    speed_t isp, osp;
    errno = 0;

    ret = tcgetattr(g_device_port, &term);
    if (ret < 0)
    {
      errnum = errno;
      yprintf(OUTPUT_LV_ERROR, "Error: Failed to get  attribute of serial port\n");
      yprintf(OUTPUT_LV_DEBUG, "Error: tcgetattr: %s(%d)\n", strerror(errnum), errnum);
      return 0;
    }
    isp = cfgetispeed(&term);
    osp = cfgetospeed(&term);

    if (baud2i(isp) != baud || baud2i(osp) != baud)
    {
      // fail to set bit rate
      yprintf(OUTPUT_LV_ERROR, "Error: Requested baudrate is %d/%d, \n   but sellected baudrate is %d/%d.\n",
              baud, baud, baud2i(isp), baud2i(osp));
      return 0;
    }
  }  // <--- check bit rate

  if (!(option(OPTION_DO_NOT_USE_YP)))
  {
    ret = write(g_device_port, "\n\nVV\n\n", 6);
    yp_usleep(10000);
    serial_recieve(recieve_throw, buf);
  }
#else
  // Windows用
  DCB dcb;

  // シリアルポートの状態操作
  GetCommState(g_hdevices, &dcb);  // シリアルポートの状態を取得
  dcb.fBinary = 1;
  dcb.fParity = 0;
  dcb.fOutxCtsFlow = 0;
  dcb.fOutxDsrFlow = 0;
  dcb.fDtrControl = DTR_CONTROL_DISABLE;
  dcb.fDsrSensitivity = FALSE;
  dcb.Parity = NOPARITY;
  dcb.StopBits = ONESTOPBIT;
  dcb.ByteSize = 8;
  dcb.BaudRate = i2baud(baud);
  SER_BAUDRATE = (double)baud;
  SetCommState(g_hdevices, &dcb);  // シリアルポートの状態を設定
#endif  // !defined(__MINGW32__)
  return 1;
}